

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

bool __thiscall
absl::numbers_internal::safe_strtou128_base
          (numbers_internal *this,string_view text,Nonnull<uint128_*> value,int base)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  byte *pbVar16;
  undefined1 auVar17 [16];
  
  uVar7 = (uint)value;
  pauVar8 = (undefined1 (*) [16])text._M_str;
  pbVar14 = (byte *)text._M_len;
  *pauVar8 = (undefined1  [16])0x0;
  if (pbVar14 != (byte *)0x0) {
    pbVar16 = pbVar14;
    if (0 < (long)this) {
      do {
        if (((&ascii_internal::kPropertyBits)[*pbVar16] & 8) == 0) break;
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 < pbVar14 + (long)this);
    }
    do {
      if (pbVar14 + (long)this <= pbVar16) {
        return false;
      }
      pbVar9 = pbVar14 + -1 + (long)this;
      this = this + -1;
    } while (((&ascii_internal::kPropertyBits)[*pbVar9] & 8) != 0);
    bVar1 = *pbVar16;
    pbVar9 = pbVar14 + (long)this + 1;
    if (((bVar1 != 0x2d) && (bVar1 != 0x2b)) || (pbVar16 = pbVar16 + 1, pbVar16 < pbVar9)) {
      if (uVar7 == 0x10) {
        pbVar13 = pbVar14 + (long)this + 1;
        uVar7 = 0x10;
        if (((1 < (long)(pbVar14 + (long)this + (1 - (long)pbVar16))) && (*pbVar16 == 0x30)) &&
           (((pbVar16[1] | 0x20) == 0x78 && (pbVar16 = pbVar16 + 2, pbVar9 <= pbVar16)))) {
          return false;
        }
      }
      else if (uVar7 == 0) {
        pbVar13 = pbVar14 + (long)this + 1;
        if (((long)(pbVar14 + (long)this) - (long)pbVar16) + 1 < 2) {
          uVar7 = 10;
          if ((long)(pbVar14 + (long)this) - (long)pbVar16 == 0) {
            bVar2 = *pbVar16;
            pbVar16 = pbVar16 + (bVar2 == 0x30);
            uVar7 = (uint)(bVar2 != 0x30) * 2 + 8;
          }
        }
        else if (*pbVar16 == 0x30) {
          if ((pbVar16[1] | 0x20) == 0x78) {
            pbVar16 = pbVar16 + 2;
            if (pbVar9 <= pbVar16) {
              return false;
            }
            uVar7 = 0x10;
          }
          else {
            pbVar16 = pbVar16 + 1;
            uVar7 = 8;
          }
        }
        else {
          uVar7 = 10;
        }
      }
      else {
        pbVar13 = pbVar9;
        if (0x22 < uVar7 - 2) {
          return false;
        }
      }
      if (bVar1 != 0x2d) {
        uVar15 = CONCAT44(0,uVar7);
        auVar17 = __udivti3(0xffffffffffffffff,0xffffffffffffffff,uVar15,0);
        if (auVar17 !=
            *(undefined1 (*) [16])
             ((anonymous_namespace)::LookupTables<absl::uint128>::kVmaxOverBase + uVar15 * 0x10)) {
          __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                        ,0x3df,
                        "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::uint128]"
                       );
        }
        if ((long)pbVar13 - (long)pbVar16 < 1) {
          uVar10 = 0;
          uVar6 = 0;
        }
        else {
          pbVar14 = pbVar16 + ((long)pbVar13 - (long)pbVar16);
          uVar6 = 0;
          uVar10 = 0;
          do {
            uVar12 = (ulong)(char)(anonymous_namespace)::kAsciiToInt[*pbVar16];
            uVar11 = (ulong)((char)(anonymous_namespace)::kAsciiToInt[*pbVar16] >> 7);
            if ((uVar12 < uVar15) <= uVar11) {
              *(ulong *)*pauVar8 = uVar6;
              *(ulong *)(*pauVar8 + 8) = uVar10;
              return false;
            }
            if (auVar17._8_8_ < uVar10 || auVar17._8_8_ - uVar10 < (ulong)(auVar17._0_8_ < uVar6)) {
LAB_0026f55a:
              *(undefined4 *)*pauVar8 = 0xffffffff;
              *(undefined4 *)(*pauVar8 + 4) = 0xffffffff;
              *(undefined4 *)(*pauVar8 + 8) = 0xffffffff;
              *(undefined4 *)(*pauVar8 + 0xc) = 0xffffffff;
              return false;
            }
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar6;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar15;
            uVar5 = SUB168(auVar3 * auVar4,0);
            uVar10 = SUB168(auVar3 * auVar4,8) + uVar10 * uVar15;
            if (~uVar11 < uVar10 || ~uVar11 - uVar10 < (ulong)(~uVar12 < uVar5)) goto LAB_0026f55a;
            uVar6 = uVar5 + uVar12;
            uVar10 = uVar11 + uVar10 + (ulong)CARRY8(uVar5,uVar12);
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 < pbVar14);
        }
        *(ulong *)*pauVar8 = uVar6;
        *(ulong *)(*pauVar8 + 8) = uVar10;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool safe_strtou128_base(absl::string_view text, absl::Nonnull<uint128*> value,
                         int base) {
  return safe_uint_internal<absl::uint128>(text, value, base);
}